

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.h
# Opt level: O0

bool absl::lts_20250127::StartsWith(string_view text,string_view prefix)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  basic_string_view<char,_std::char_traits<char>_> __x;
  string_view possible_match;
  string_view prefix_local;
  string_view text_local;
  
  prefix_local._M_len = (size_t)prefix._M_str;
  possible_match._M_str = (char *)prefix._M_len;
  prefix_local._M_str = (char *)text._M_len;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&possible_match._M_str);
  if (bVar1) {
    text_local._M_str._7_1_ = true;
  }
  else {
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&prefix_local._M_str);
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&possible_match._M_str);
    if (sVar2 < sVar3) {
      text_local._M_str._7_1_ = false;
    }
    else {
      sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&possible_match._M_str)
      ;
      __x = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)&prefix_local._M_str,0,
                       sVar2);
      possible_match._M_len = (size_t)__x._M_str;
      __y._M_str = (char *)prefix_local._M_len;
      __y._M_len = (size_t)possible_match._M_str;
      text_local._M_str._7_1_ = std::operator==(__x,__y);
    }
  }
  return text_local._M_str._7_1_;
}

Assistant:

inline constexpr bool StartsWith(absl::string_view text,
                                 absl::string_view prefix) noexcept {
  if (prefix.empty()) {
    return true;
  }
  if (text.size() < prefix.size()) {
    return false;
  }
  absl::string_view possible_match = text.substr(0, prefix.size());

  return possible_match == prefix;
}